

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O2

ecdh_key * ssh_ecdhkex_m_new(ssh_kex *kex,_Bool is_server)

{
  undefined8 *puVar1;
  ptrlen bytes;
  undefined8 uVar2;
  undefined8 *puVar3;
  strbuf *buf_o;
  void *buf;
  mp_int *x;
  MontgomeryPoint *pMVar4;
  undefined7 in_register_00000031;
  uint bit;
  ulong bit_00;
  
  puVar1 = (undefined8 *)kex->extra;
  uVar2 = (*(code *)*puVar1)(kex,CONCAT71(in_register_00000031,is_server));
  puVar3 = (undefined8 *)safemalloc(1,0x28,0);
  *(anon_union_8_1_10d1415b_for_ssh_kex_5 *)(puVar3 + 4) = kex->field_4;
  *puVar3 = puVar1;
  puVar3[1] = uVar2;
  buf_o = strbuf_new_nm();
  buf = strbuf_append(buf_o,*(size_t *)(puVar3[1] + 0x20));
  random_read(buf,*(size_t *)(puVar3[1] + 0x20));
  bytes.ptr = buf_o->u;
  bytes.len = buf_o->len;
  x = mp_from_bytes_le(bytes);
  puVar3[2] = x;
  mp_reduce_mod_2to(x,*(size_t *)(puVar3[1] + 0x18));
  mp_set_bit((mp_int *)puVar3[2],*(long *)(puVar3[1] + 0x18) - 1,1);
  for (bit_00 = 0; bit_00 < *(uint *)(puVar3[1] + 0x40); bit_00 = bit_00 + 1) {
    mp_set_bit((mp_int *)puVar3[2],bit_00,0);
  }
  strbuf_free(buf_o);
  pMVar4 = ecc_montgomery_multiply(*(MontgomeryPoint **)(puVar3[1] + 0x38),(mp_int *)puVar3[2]);
  puVar3[3] = pMVar4;
  return (ecdh_key *)(puVar3 + 4);
}

Assistant:

ecdh_key *ssh_ecdhkex_m_new(const ssh_kex *kex, bool is_server)
{
    const struct eckex_extra *extra = (const struct eckex_extra *)kex->extra;
    const struct ec_curve *curve = extra->curve();

    ecdh_key_m *dhm = snew(ecdh_key_m);
    dhm->ek.vt = kex->ecdh_vt;
    dhm->extra = extra;
    dhm->curve = curve;

    strbuf *bytes = strbuf_new_nm();
    random_read(strbuf_append(bytes, dhm->curve->fieldBytes),
                dhm->curve->fieldBytes);

    dhm->private = mp_from_bytes_le(ptrlen_from_strbuf(bytes));

    /* Ensure the private key has the highest valid bit set, and no
     * bits _above_ the highest valid one */
    mp_reduce_mod_2to(dhm->private, dhm->curve->fieldBits);
    mp_set_bit(dhm->private, dhm->curve->fieldBits - 1, 1);

    /* Clear a curve-specific number of low bits */
    for (unsigned bit = 0; bit < dhm->curve->m.log2_cofactor; bit++)
        mp_set_bit(dhm->private, bit, 0);

    strbuf_free(bytes);

    dhm->m_public = ecc_montgomery_multiply(dhm->curve->m.G, dhm->private);

    return &dhm->ek;
}